

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3Fts5ExprNew(Fts5Config *pConfig,int bPhraseToAnd,int iCol,char *zExpr,Fts5Expr **ppNew,
                      char **pzErr)

{
  char cVar1;
  uint uVar2;
  Fts5Parse *pFVar3;
  undefined8 uVar4;
  byte bVar5;
  int iVar6;
  fts5yyParser *fts5yypParser_00;
  byte *pbVar7;
  Fts5ExprNode *pFVar8;
  Fts5ExprPhrase *pFVar9;
  Fts5Colset *pFVar10;
  Fts5ExprNode *p;
  Fts5ExprNearset *pFVar11;
  Fts5Colset *pFVar12;
  Fts5Expr *pFVar13;
  long lVar14;
  Fts5ExprNode *pFVar15;
  Fts5ExprNode *pFVar16;
  fts5YYMINORTYPE *pfVar17;
  char *pcVar18;
  fts5YYMINORTYPE *extraout_RDX;
  fts5YYMINORTYPE *extraout_RDX_00;
  fts5YYMINORTYPE *extraout_RDX_01;
  fts5YYMINORTYPE *fts5yypminor;
  fts5YYMINORTYPE *extraout_RDX_02;
  fts5YYMINORTYPE *extraout_RDX_03;
  fts5YYMINORTYPE *extraout_RDX_04;
  ulong uVar19;
  fts5yyStackEntry *pfVar20;
  byte bVar21;
  ulong uVar22;
  fts5yyParser *fts5yypParser;
  fts5yyStackEntry *pfVar23;
  long in_FS_OFFSET;
  ulong uStack_d0;
  uint local_c4;
  Fts5Colset *local_a0;
  Fts5Parse local_78;
  Fts5Colset *local_48;
  undefined1 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  *ppNew = (Fts5Expr *)0x0;
  *pzErr = (char *)0x0;
  local_78.apPhrase = (Fts5ExprPhrase **)0x0;
  local_78.pExpr = (Fts5ExprNode *)0x0;
  local_78.zErr = (char *)0x0;
  local_78.rc = 0;
  local_78.nPhrase = 0;
  local_78._44_4_ = 0;
  local_78.bPhraseToAnd = bPhraseToAnd;
  fts5yypParser_00 = (fts5yyParser *)sqlite3_malloc64(0x980);
  if (fts5yypParser_00 == (fts5yyParser *)0x0) {
    iVar6 = 7;
    goto LAB_001c33dc;
  }
  fts5yypParser_00->fts5yystack = fts5yypParser_00->fts5yystk0;
  fts5yypParser_00->fts5yystackEnd = fts5yypParser_00->fts5yystk0 + 99;
  fts5yypParser_00->fts5yytos = fts5yypParser_00->fts5yystk0;
  fts5yypParser_00->fts5yystk0[0].stateno = '\0';
  fts5yypParser_00->fts5yystk0[0].major = '\0';
  pFVar12 = (Fts5Colset *)zExpr;
  local_78.pConfig = pConfig;
  local_a0 = (Fts5Colset *)zExpr;
  do {
    while( true ) {
      bVar5 = (byte)pFVar12->nCol;
      if (1 < bVar5 - 9) break;
switchD_001c2b79_caseD_0:
      zExpr = (char *)((long)&((Fts5Colset *)zExpr)->nCol + 1);
      pFVar12 = (Fts5Colset *)((long)&pFVar12->nCol + 1);
    }
    pfVar17 = (fts5YYMINORTYPE *)(ulong)(bVar5 - 0x20);
    if (0xd < bVar5 - 0x20) {
      if (bVar5 == 0xd) goto switchD_001c2b79_caseD_0;
      pcVar18 = (char *)pfVar17;
      if (bVar5 == 0) {
        local_c4 = 0;
        uStack_d0 = 1;
        uVar19 = 1;
      }
      else if (bVar5 == 0x3a) {
        uStack_d0 = 1;
        uVar19 = 1;
        local_c4 = 5;
      }
      else if (bVar5 == 0x5e) {
        uStack_d0 = 1;
        uVar19 = 1;
        local_c4 = 0xc;
      }
      else if (bVar5 == 0x7b) {
        uStack_d0 = 1;
        uVar19 = 1;
        local_c4 = 7;
      }
      else {
        if (bVar5 != 0x7d) goto switchD_001c2b79_caseD_1;
        uStack_d0 = 1;
        uVar19 = 1;
        local_c4 = 8;
      }
      goto LAB_001c2d66;
    }
    pcVar18 = (char *)((long)&switchD_001c2b79::switchdataD_001e2fdc +
                      (long)(int)(&switchD_001c2b79::switchdataD_001e2fdc)[(long)pfVar17]);
    switch(pfVar17) {
    case (fts5YYMINORTYPE *)0x0:
      goto switchD_001c2b79_caseD_0;
    default:
switchD_001c2b79_caseD_1:
      if ((-1 < (char)bVar5) && ((&DAT_001e8a60)[bVar5] == '\0')) {
        sqlite3Fts5ParseError(&local_78,"fts5: syntax error near \"%.1s\"",pFVar12);
        pcVar18 = (char *)extraout_RDX_03;
        goto LAB_001c3324;
      }
      uVar19 = 1;
      while ((lVar14 = (long)*(char *)((long)pFVar12->aiCol + (uVar19 - 4)), lVar14 < 0 ||
             ((&DAT_001e8a60)[lVar14] != '\0'))) {
        uVar19 = uVar19 + 1;
      }
      if ((int)uVar19 == 2) {
        local_c4 = (uint)((short)pFVar12->nCol != 0x524f) * 8 + 1;
        uStack_d0 = 2;
      }
      else if ((int)uVar19 == 3) {
        iVar6 = bcmp(pFVar12,"NOT",3);
        local_c4 = 9;
        if (iVar6 == 0) {
          local_c4 = 3;
        }
        iVar6 = bcmp(pFVar12,"AND",3);
        if (iVar6 == 0) {
          local_c4 = 2;
        }
        uStack_d0 = 3;
        pcVar18 = (char *)extraout_RDX_00;
      }
      else {
        uStack_d0 = uVar19 & 0xffffffff;
LAB_001c2d5f:
        local_c4 = 9;
      }
      break;
    case (fts5YYMINORTYPE *)0x2:
      pFVar10 = pFVar12;
      do {
        cVar1 = *(char *)((long)&pFVar10->nCol + 1);
        if (cVar1 == '\"') {
          if (*(char *)((long)&pFVar10->nCol + 2) != '\"') {
            uVar19 = (long)pFVar10 + (2 - (long)zExpr);
            uStack_d0 = uVar19;
            goto LAB_001c2d5f;
          }
          pFVar10 = (Fts5Colset *)((long)&pFVar10->nCol + 2);
        }
        else {
          pFVar10 = (Fts5Colset *)((long)&pFVar10->nCol + 1);
        }
      } while (cVar1 != '\0');
      sqlite3Fts5ParseError(&local_78,"unterminated string");
      pcVar18 = (char *)extraout_RDX;
LAB_001c3324:
      local_c4 = 0;
      uStack_d0 = 1;
      goto LAB_001c2d76;
    case (fts5YYMINORTYPE *)0x8:
      uStack_d0 = 1;
      uVar19 = 1;
      local_c4 = 10;
      break;
    case (fts5YYMINORTYPE *)0x9:
      uStack_d0 = 1;
      uVar19 = 1;
      local_c4 = 0xb;
      break;
    case (fts5YYMINORTYPE *)0xa:
      uStack_d0 = 1;
      uVar19 = 1;
      local_c4 = 0xf;
      break;
    case (fts5YYMINORTYPE *)0xb:
      uStack_d0 = 1;
      uVar19 = 1;
      local_c4 = 0xe;
      break;
    case (fts5YYMINORTYPE *)0xc:
      uStack_d0 = 1;
      uVar19 = 1;
      local_c4 = 0xd;
      break;
    case (fts5YYMINORTYPE *)0xd:
      uStack_d0 = 1;
      uVar19 = 1;
      local_c4 = 6;
    }
LAB_001c2d66:
    local_a0 = (Fts5Colset *)((long)pFVar12->aiCol + (long)(int)uVar19 + -4);
LAB_001c2d76:
    local_40 = &DAT_aaaaaaaaaaaaaaaa;
    fts5yypParser_00->pParse = &local_78;
    pfVar20 = fts5yypParser_00->fts5yytos;
    bVar5 = pfVar20->stateno;
    while( true ) {
      bVar21 = (byte)local_c4;
      if (bVar5 < 0x23) {
        lVar14 = (ulong)",,,,,,3M+\f\x0eSR\x0e\x17\x17\x1f\x1fGJNQV[\x0655<@D5W\\5]"[bVar5] +
                 (ulong)local_c4;
        pbVar7 = "PPPPPP_PPiPnnPnnPPPPP[PPPedPPZgPPhP" + bVar5;
        if ("\x10\x11\x12\x13\x14\x16\x16\x18\x18\x11\x12\x13\x14\a\x16\t\x18\x11\x12\x13\x14\t\x16\t\x18\r\x11\x12\x13\x14\x1a\x16\x18\x18\x11\x12\x13\x14\x0f\x16\t\x18\x11\x12\x13\x14\x1a\x16\x15\x18\x06\a\t\t\n\f\f\x06\a\x15\t\x18\x19\f\x12\x05\x14\x0e\x16\x05\x18\x03\x01\x02\x03\x01\x02\x03"
            [lVar14] == bVar21) {
          pbVar7 = "Q\x14`\x06\x1ccb\x1a\x1a\x12`\x06\x1c\x11b8\x1a\x13`\x06\x1c\x0eb\x0e\x1a\x1f\\`\x06\x1clb\x19\x1a\x15`\x06\x1cNb:\x1a\x1d`\x06\x1ckb\x16\x1a\x18\x10\f\v\x01\r\r\x18\x10\x17\v!\"\ra\b\x1b b\a\x1a\x03\x04\x05\x03\x04\x05\x03S\x04\x05\x03?\x05\x03>\f\x02V\r\t\x1e\n\n69KNN59\x0fRRG"
                   + lVar14;
        }
        bVar5 = *pbVar7;
        pcVar18 = (char *)
                  "\x10\x11\x12\x13\x14\x16\x16\x18\x18\x11\x12\x13\x14\a\x16\t\x18\x11\x12\x13\x14\t\x16\t\x18\r\x11\x12\x13\x14\x1a\x16\x18\x18\x11\x12\x13\x14\x0f\x16\t\x18\x11\x12\x13\x14\x1a\x16\x15\x18\x06\a\t\t\n\f\f\x06\a\x15\t\x18\x19\f\x12\x05\x14\x0e\x16\x05\x18\x03\x01\x02\x03\x01\x02\x03"
        ;
      }
      if (bVar5 < 0x53) break;
      if (((bVar5 == 0x6e) || (bVar5 == 0x69)) && (fts5yypParser_00->fts5yystackEnd <= pfVar20))
      goto LAB_001c3257;
      if (0x1b < bVar5 - 0x53) goto switchD_001c2e1c_caseD_5f;
      pFVar3 = fts5yypParser_00->pParse;
      switch((uint)bVar5) {
      case 0x53:
        pFVar3->pExpr = (Fts5ExprNode *)(pfVar20->minor).fts5yy0.p;
        break;
      case 0x54:
        pFVar9 = (Fts5ExprPhrase *)sqlite3Fts5ParseColsetInvert(pFVar3,pfVar20[-1].minor.fts5yy11);
        goto LAB_001c2fe5;
      default:
        pFVar8 = (Fts5ExprNode *)pfVar20[-1].minor.fts5yy0.p;
        goto LAB_001c30da;
      case 0x56:
      case 0x59:
        pFVar8 = (Fts5ExprNode *)
                 sqlite3Fts5ParseColset(pFVar3,(Fts5Colset *)0x0,&(pfVar20->minor).fts5yy0);
        goto LAB_001c2f05;
      case 0x57:
        pFVar10 = sqlite3Fts5ParseColset(pFVar3,(Fts5Colset *)0x0,&(pfVar20->minor).fts5yy0);
        pfVar20[-1].minor.fts5yy11 = pFVar10;
        pFVar9 = (Fts5ExprPhrase *)sqlite3Fts5ParseColsetInvert(pFVar3,pFVar10);
        goto LAB_001c3036;
      case 0x58:
        pFVar9 = (Fts5ExprPhrase *)
                 sqlite3Fts5ParseColset(pFVar3,pfVar20[-1].minor.fts5yy11,&(pfVar20->minor).fts5yy0)
        ;
        goto LAB_001c3036;
      case 0x5a:
        pFVar8 = pfVar20[-2].minor.fts5yy24;
        pFVar15 = (pfVar20->minor).fts5yy24;
        iVar6 = 2;
        goto LAB_001c30c2;
      case 0x5b:
        pFVar8 = pfVar20[-2].minor.fts5yy24;
        pFVar15 = (pfVar20->minor).fts5yy24;
        iVar6 = 1;
        goto LAB_001c30c2;
      case 0x5c:
        pFVar8 = pfVar20[-2].minor.fts5yy24;
        pFVar15 = (pfVar20->minor).fts5yy24;
        iVar6 = 3;
LAB_001c30c2:
        pFVar8 = sqlite3Fts5ParseNode(pFVar3,iVar6,pFVar8,pFVar15,(Fts5ExprNearset *)0x0);
LAB_001c30da:
        pfVar20[-2].minor.fts5yy0.p = (char *)pFVar8;
        break;
      case 0x5d:
        sqlite3Fts5ParseSetColset(pFVar3,pfVar20[-1].minor.fts5yy24,pfVar20[-4].minor.fts5yy11);
        pcVar18 = pfVar20[-1].minor.fts5yy0.p;
        goto LAB_001c3184;
      case 0x5f:
      case 0x60:
        break;
      case 0x61:
        pFVar8 = pfVar20[-1].minor.fts5yy24;
        pFVar15 = (pfVar20->minor).fts5yy24;
        if (pFVar3->rc == 0) {
          p = pFVar8;
          if (pFVar8->eType == 2) {
            p = pFVar8->apChild[(long)pFVar8->nChild + -1];
          }
          if (pFVar15->eType == 0) {
            sqlite3Fts5ParseNodeFree(pFVar15);
            pFVar3->nPhrase = pFVar3->nPhrase + -1;
          }
          else if (p->eType == 0) {
            pFVar16 = pFVar15;
            if (p != pFVar8) {
              pFVar8->apChild[(long)pFVar8->nChild + -1] = pFVar15;
              pFVar16 = pFVar8;
            }
            uVar2 = pFVar15->pNear->nPhrase;
            lVar14 = (long)(int)(~uVar2 + pFVar3->nPhrase);
            memmove(pFVar3->apPhrase + lVar14,pFVar3->apPhrase + lVar14 + 1,(long)(int)uVar2 << 3);
            pFVar3->nPhrase = pFVar3->nPhrase + -1;
            sqlite3Fts5ParseNodeFree(p);
            pFVar8 = pFVar16;
          }
          else {
            pFVar8 = sqlite3Fts5ParseNode(pFVar3,2,pFVar8,pFVar15,(Fts5ExprNearset *)0x0);
          }
        }
        else {
          sqlite3Fts5ParseNodeFree(pFVar8);
          sqlite3Fts5ParseNodeFree(pFVar15);
          pFVar8 = (Fts5ExprNode *)0x0;
        }
        pfVar20[-1].minor.fts5yy0.p = (char *)pFVar8;
        break;
      case 0x62:
        pFVar8 = sqlite3Fts5ParseNode
                           (pFVar3,9,(Fts5ExprNode *)0x0,(Fts5ExprNode *)0x0,
                            (pfVar20->minor).fts5yy46);
        goto LAB_001c2f05;
      case 99:
        pFVar8 = sqlite3Fts5ParseNode
                           (pFVar3,9,(Fts5ExprNode *)0x0,(Fts5ExprNode *)0x0,
                            (pfVar20->minor).fts5yy46);
        sqlite3Fts5ParseSetColset(pFVar3,pFVar8,pfVar20[-2].minor.fts5yy11);
        pfVar20[-2].minor.fts5yy24 = pFVar8;
        break;
      case 100:
      case 0x67:
        pFVar8 = (Fts5ExprNode *)
                 sqlite3Fts5ParseNearset(pFVar3,(Fts5ExprNearset *)0x0,(pfVar20->minor).fts5yy53);
LAB_001c2f05:
        (pfVar20->minor).fts5yy46 = (Fts5ExprNearset *)pFVar8;
        break;
      case 0x65:
        pFVar9 = (pfVar20->minor).fts5yy53;
        if (pFVar9 == (Fts5ExprPhrase *)0x0) {
          pFVar9 = (Fts5ExprPhrase *)0x0;
        }
        else if (pFVar9->nTerm != 0) {
          pFVar9->aTerm[0].bFirst = '\x01';
          pFVar9 = (pfVar20->minor).fts5yy53;
        }
        pFVar11 = sqlite3Fts5ParseNearset(pFVar3,(Fts5ExprNearset *)0x0,pFVar9);
        pfVar20[-1].minor.fts5yy46 = pFVar11;
        break;
      case 0x66:
        if ((pfVar20[-4].minor.fts5yy0.n != 4) || ((pfVar20[-4].minor.fts5yy11)->nCol != 0x5241454e)
           ) {
          sqlite3Fts5ParseError(pFVar3,"fts5: syntax error near \"%.*s\"");
        }
        if (pfVar20[-2].minor.fts5yy11 != (Fts5Colset *)0x0) {
          uVar2 = pfVar20[-1].minor.fts5yy0.n;
          if (uVar2 == 0) {
            iVar6 = 10;
          }
          else {
            uVar19 = 0;
            uVar22 = 0;
            if (0 < (int)uVar2) {
              uVar22 = (ulong)uVar2;
            }
            iVar6 = 0;
            for (; uVar22 != uVar19; uVar19 = uVar19 + 1) {
              bVar21 = pfVar20[-1].minor.fts5yy0.p[uVar19];
              if (9 < (byte)(bVar21 - 0x30)) {
                sqlite3Fts5ParseError(pFVar3,"expected integer, got \"%.*s\"");
                goto LAB_001c3180;
              }
              iVar6 = iVar6 * 10 + (uint)bVar21 + -0x30;
            }
          }
          (pfVar20[-2].minor.fts5yy11)->nCol = iVar6;
        }
LAB_001c3180:
        pcVar18 = pfVar20[-2].minor.fts5yy0.p;
LAB_001c3184:
        pfVar20[-4].minor.fts5yy0.p = pcVar18;
        break;
      case 0x68:
        pFVar9 = (Fts5ExprPhrase *)
                 sqlite3Fts5ParseNearset
                           (pFVar3,pfVar20[-1].minor.fts5yy46,(pfVar20->minor).fts5yy53);
        goto LAB_001c3036;
      case 0x69:
        pfVar20[1].minor.fts5yy0.p = (char *)0x0;
        pfVar20[1].minor.fts5yy0.n = 0;
        break;
      case 0x6a:
        uVar4 = *(undefined8 *)((long)&pfVar20->minor + 8);
        pfVar20[-1].minor.fts5yy0.p = (pfVar20->minor).fts5yy0.p;
        *(undefined8 *)((long)&pfVar20[-1].minor + 8) = uVar4;
        break;
      case 0x6b:
        pFVar9 = sqlite3Fts5ParseTerm
                           (pFVar3,pfVar20[-3].minor.fts5yy53,&pfVar20[-1].minor.fts5yy0,
                            (pfVar20->minor).fts5yyinit);
LAB_001c2fe5:
        pfVar20[-3].minor.fts5yy53 = pFVar9;
        break;
      case 0x6c:
        pFVar9 = sqlite3Fts5ParseTerm
                           (pFVar3,(Fts5ExprPhrase *)0x0,&pfVar20[-1].minor.fts5yy0,
                            (pfVar20->minor).fts5yyinit);
LAB_001c3036:
        pfVar20[-1].minor.fts5yy53 = pFVar9;
        break;
      case 0x6d:
        (pfVar20->minor).fts5yyinit = 1;
        break;
      case 0x6e:
        pfVar20[1].minor.fts5yyinit = 0;
      }
switchD_001c2e1c_caseD_5f:
      uVar19 = (ulong)bVar5 + 0xffffffad & 0xffffffff;
      bVar21 = "\x10\x14\x14\x14\x14\x15\x15\x11\x11\x11\x11\x11\x11\x13\x13\x12\x12\x16\x16\x16\x17\x17\x19\x19\x18\x18\x1a\x1a"
               [uVar19];
      pfVar23 = pfVar20 + fts5yyRuleInfoNRhs[uVar19];
      pfVar20 = pfVar23 + 1;
      pcVar18 = fts5yy_reduce_ofst;
      bVar5 = "Q\x14`\x06\x1ccb\x1a\x1a\x12`\x06\x1c\x11b8\x1a\x13`\x06\x1c\x0eb\x0e\x1a\x1f\\`\x06\x1clb\x19\x1a\x15`\x06\x1cNb:\x1a\x1d`\x06\x1ckb\x16\x1a\x18\x10\f\v\x01\r\r\x18\x10\x17\v!\"\ra\b\x1b b\a\x1a\x03\x04\x05\x03\x04\x05\x03S\x04\x05\x03?\x05\x03>\f\x02V\r\t\x1e\n\n69KNN59\x0fRRG"
              [(long)fts5yy_reduce_ofst[pfVar23->stateno] + (ulong)bVar21];
      fts5yypParser_00->fts5yytos = pfVar20;
      pfVar20->stateno = bVar5;
      pfVar23[1].major = bVar21;
    }
    if (0x4f < bVar5) {
      if (bVar5 == 0x51) {
        fts5yypParser_00->fts5yytos = pfVar20 + -1;
      }
      else {
        local_40 = (undefined1 *)CONCAT44(local_40._4_4_,(int)uStack_d0);
        pFVar3 = fts5yypParser_00->pParse;
        local_48 = pFVar12;
        sqlite3Fts5ParseError(pFVar3,"fts5: syntax error near \"%.*s\"",uStack_d0);
        fts5yypParser_00->pParse = pFVar3;
        fts5yy_destructor((fts5yyParser *)(ulong)bVar21,(uchar)&local_48,fts5yypminor);
        pcVar18 = (char *)extraout_RDX_02;
      }
      goto LAB_001c32de;
    }
    fts5yypParser_00->fts5yytos = pfVar20 + 1;
    if (pfVar20 + 1 <= fts5yypParser_00->fts5yystackEnd) {
      if (0x22 < bVar5) {
        bVar5 = bVar5 + 0x1f;
      }
      pfVar20[1].stateno = bVar5;
      pfVar20[1].major = bVar21;
      pfVar20[1].minor.fts5yy11 = pFVar12;
      pfVar20[1].minor.fts5yy0.n = (int)uStack_d0;
      goto LAB_001c32de;
    }
    fts5yypParser_00->fts5yytos = pfVar20;
LAB_001c3257:
    fts5yyStackOverflow(fts5yypParser_00);
    pcVar18 = (char *)extraout_RDX_01;
LAB_001c32de:
  } while (((ulong)local_c4 != 0) &&
          (zExpr = (char *)local_a0, pFVar12 = local_a0, local_78.rc == 0));
  for (pfVar20 = fts5yypParser_00->fts5yytos; fts5yypParser_00->fts5yystack < pfVar20;
      pfVar20 = pfVar20 + -1) {
    if (0xf < pfVar20->major) {
      fts5yy_destructor((fts5yyParser *)(ulong)pfVar20->major,(char)pfVar20 + '\b',
                        (fts5YYMINORTYPE *)pcVar18);
      pcVar18 = (char *)extraout_RDX_04;
    }
  }
  sqlite3_free(fts5yypParser_00);
  if (local_78.rc == 0) {
    if ((iCol < pConfig->nCol) &&
       (pFVar12 = (Fts5Colset *)sqlite3Fts5MallocZero(&local_78.rc,8), pFVar12 != (Fts5Colset *)0x0)
       ) {
      pFVar12->nCol = 1;
      pFVar12->aiCol[0] = iCol;
      sqlite3Fts5ParseSetColset(&local_78,local_78.pExpr,pFVar12);
    }
    if (local_78.rc != 0) goto LAB_001c33a5;
    pFVar13 = (Fts5Expr *)sqlite3_malloc(0x28);
    *ppNew = pFVar13;
    if (pFVar13 == (Fts5Expr *)0x0) {
      local_78.rc = 7;
      goto LAB_001c33a5;
    }
    pFVar13->pRoot = local_78.pExpr;
    pFVar13->pIndex = (Fts5Index *)0x0;
    pFVar13->pConfig = pConfig;
    pFVar13->apExprPhrase = local_78.apPhrase;
    pFVar13->nPhrase = local_78.nPhrase;
    pFVar13->bDesc = 0;
    local_78.apPhrase = (Fts5ExprPhrase **)0x0;
  }
  else {
LAB_001c33a5:
    sqlite3Fts5ParseNodeFree(local_78.pExpr);
  }
  sqlite3_free(local_78.apPhrase);
  if (*pzErr == (char *)0x0) {
    *pzErr = local_78.zErr;
  }
  else {
    sqlite3_free(local_78.zErr);
  }
  iVar6 = local_78.rc;
LAB_001c33dc:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar6;
}

Assistant:

static int sqlite3Fts5ExprNew(
  Fts5Config *pConfig,            /* FTS5 Configuration */
  int bPhraseToAnd,
  int iCol,
  const char *zExpr,              /* Expression text */
  Fts5Expr **ppNew,
  char **pzErr
){
  Fts5Parse sParse;
  Fts5Token token;
  const char *z = zExpr;
  int t;                          /* Next token type */
  void *pEngine;
  Fts5Expr *pNew;

  *ppNew = 0;
  *pzErr = 0;
  memset(&sParse, 0, sizeof(sParse));
  sParse.bPhraseToAnd = bPhraseToAnd;
  pEngine = sqlite3Fts5ParserAlloc(fts5ParseAlloc);
  if( pEngine==0 ){ return SQLITE_NOMEM; }
  sParse.pConfig = pConfig;

  do {
    t = fts5ExprGetToken(&sParse, &z, &token);
    sqlite3Fts5Parser(pEngine, t, token, &sParse);
  }while( sParse.rc==SQLITE_OK && t!=FTS5_EOF );
  sqlite3Fts5ParserFree(pEngine, fts5ParseFree);

  assert( sParse.pExpr || sParse.rc!=SQLITE_OK );
  assert_expr_depth_ok(sParse.rc, sParse.pExpr);

  /* If the LHS of the MATCH expression was a user column, apply the
  ** implicit column-filter.  */
  if( sParse.rc==SQLITE_OK && iCol<pConfig->nCol ){
    int n = sizeof(Fts5Colset);
    Fts5Colset *pColset = (Fts5Colset*)sqlite3Fts5MallocZero(&sParse.rc, n);
    if( pColset ){
      pColset->nCol = 1;
      pColset->aiCol[0] = iCol;
      sqlite3Fts5ParseSetColset(&sParse, sParse.pExpr, pColset);
    }
  }

  assert( sParse.rc!=SQLITE_OK || sParse.zErr==0 );
  if( sParse.rc==SQLITE_OK ){
    *ppNew = pNew = sqlite3_malloc(sizeof(Fts5Expr));
    if( pNew==0 ){
      sParse.rc = SQLITE_NOMEM;
      sqlite3Fts5ParseNodeFree(sParse.pExpr);
    }else{
      pNew->pRoot = sParse.pExpr;
      pNew->pIndex = 0;
      pNew->pConfig = pConfig;
      pNew->apExprPhrase = sParse.apPhrase;
      pNew->nPhrase = sParse.nPhrase;
      pNew->bDesc = 0;
      sParse.apPhrase = 0;
    }
  }else{
    sqlite3Fts5ParseNodeFree(sParse.pExpr);
  }

  sqlite3_free(sParse.apPhrase);
  if( 0==*pzErr ){
    *pzErr = sParse.zErr;
  }else{
    sqlite3_free(sParse.zErr);
  }
  return sParse.rc;
}